

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O3

void anon_unknown.dwarf_1ee9f1::setOutputFrameBuffer
               (FrameBuffer *frameBuffer,int pixelType,Array2D<unsigned_int> *uData,
               Array2D<float> *fData,Array2D<half> *hData,int width)

{
  char *name;
  bool in_R10B;
  Slice local_48;
  
  if (pixelType == 2) {
    Imf_2_5::Slice::Slice
              (&local_48,HALF,(char *)hData,2,(long)width * 2,1,1,0.0,false,SUB81((long)width * 2,0)
              );
    name = "HALF";
  }
  else if (pixelType == 1) {
    Imf_2_5::Slice::Slice
              (&local_48,FLOAT,(char *)fData,4,(long)width << 2,1,1,0.0,false,SUB81(fData,0));
    name = "FLOAT";
  }
  else {
    if (pixelType != 0) {
      return;
    }
    Imf_2_5::Slice::Slice(&local_48,UINT,(char *)uData,4,(long)width << 2,1,1,0.0,in_R10B,false);
    name = "UINT";
  }
  Imf_2_5::FrameBuffer::insert(frameBuffer,name,&local_48);
  return;
}

Assistant:

void setOutputFrameBuffer(FrameBuffer& frameBuffer, int pixelType,
                          Array2D<unsigned int>& uData, Array2D<float>& fData,
                          Array2D<half>& hData, int width)
{
    switch (pixelType)
    {
        case 0:
            frameBuffer.insert ("UINT",
                                Slice (IMF::UINT,
                                (char *) (&uData[0][0]),
                                sizeof (uData[0][0]) * 1,
                                sizeof (uData[0][0]) * width));
            break;
        case 1:
            frameBuffer.insert ("FLOAT",
                                Slice (IMF::FLOAT,
                                (char *) (&fData[0][0]),
                                sizeof (fData[0][0]) * 1,
                                sizeof (fData[0][0]) * width));
            break;
        case 2:
            frameBuffer.insert ("HALF",
                                Slice (IMF::HALF,
                                (char *) (&hData[0][0]),
                                sizeof (hData[0][0]) * 1,
                                sizeof (hData[0][0]) * width));
            break;
    }
}